

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O3

TrackSet<ASDCP::MXF::TimecodeComponent> *
ASDCP::MXF::CreateTimecodeTrack<ASDCP::MXF::SourcePackage>
          (TrackSet<ASDCP::MXF::TimecodeComponent> *__return_storage_ptr__,OP1aHeader *Header,
          SourcePackage *Package,Rational *tc_edit_rate,ui32_t tc_frame_rate,ui64_t TCStart,
          Dictionary *Dict)

{
  undefined4 *puVar1;
  TimecodeComponent *pTVar2;
  Dictionary *in_stack_ffffffffffffff78;
  long *local_70 [2];
  long local_60 [2];
  undefined1 local_50 [8];
  TimecodeComponent local_48;
  undefined4 local_47;
  undefined4 uStack_43;
  undefined4 uStack_3f;
  undefined4 uStack_3b;
  
  if (Dict != (Dictionary *)0x0) {
    puVar1 = (undefined4 *)ASDCP::Dictionary::Type((MDD_t)Dict);
    local_48 = (TimecodeComponent)0x1;
    local_47 = *puVar1;
    uStack_43 = puVar1[1];
    uStack_3f = puVar1[2];
    uStack_3b = puVar1[3];
    local_50 = (undefined1  [8])&PTR__IArchive_0016acf0;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Timecode Track","");
    CreateTrackAndSequence<ASDCP::MXF::SourcePackage,ASDCP::MXF::TimecodeComponent>
              (__return_storage_ptr__,(MXF *)Header,(OP1aHeader *)Package,(SourcePackage *)local_70,
               (string *)tc_edit_rate,(Rational *)local_50,(UL *)0x1,(MDD_t)Dict,
               in_stack_ffffffffffffff78);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    pTVar2 = (TimecodeComponent *)operator_new(0xe8);
    ASDCP::MXF::TimecodeComponent::TimecodeComponent(pTVar2,Dict);
    __return_storage_ptr__->Clip = pTVar2;
    (**(code **)(*(long *)Header + 0x68))(Header,pTVar2);
    std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
              ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
               (__return_storage_ptr__->Sequence + 0xd8),
               (value_type *)(__return_storage_ptr__->Clip + 0x58));
    pTVar2 = __return_storage_ptr__->Clip;
    *(short *)(pTVar2 + 0xd0) = (short)tc_frame_rate;
    *(ui64_t *)(pTVar2 + 0xd8) = TCStart;
    pTVar2[0xa8] = local_48;
    *(ulong *)(pTVar2 + 0xa9) = CONCAT44(uStack_43,local_47);
    *(ulong *)(pTVar2 + 0xb1) = CONCAT44(uStack_3b,uStack_3f);
    return __return_storage_ptr__;
  }
  __assert_fail("Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                ,0x21c,
                "TrackSet<TimecodeComponent> ASDCP::MXF::CreateTimecodeTrack(OP1aHeader &, PackageT &, const MXF::Rational &, ui32_t, ui64_t, const Dictionary *) [PackageT = ASDCP::MXF::SourcePackage]"
               );
}

Assistant:

TrackSet<TimecodeComponent>
	CreateTimecodeTrack(OP1aHeader& Header, PackageT& Package,
			    const MXF::Rational& tc_edit_rate, ui32_t tc_frame_rate, ui64_t TCStart, const Dictionary *Dict)
	{
	  assert(Dict);
	  UL TCUL(Dict->ul(MDD_TimecodeDataDef));

	  TrackSet<TimecodeComponent> NewTrack =
	    CreateTrackAndSequence<PackageT, TimecodeComponent>(Header, Package, "Timecode Track",
								tc_edit_rate, TCUL, 1, Dict);

	  NewTrack.Clip = new TimecodeComponent(Dict);
	  Header.AddChildObject(NewTrack.Clip);
	  NewTrack.Sequence->StructuralComponents.push_back(NewTrack.Clip->InstanceUID);
	  NewTrack.Clip->RoundedTimecodeBase = tc_frame_rate;
	  NewTrack.Clip->StartTimecode = TCStart;
	  NewTrack.Clip->DataDefinition = TCUL;

	  return NewTrack;
	}